

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<long_double,_short>::Run
          (DataTransform<long_double,_short> *this,istream *input_stream)

{
  short sVar1;
  short sVar2;
  int iVar3;
  NumericType NVar4;
  WarningType WVar5;
  bool bVar6;
  char *__nptr;
  bool bVar7;
  short data_to_write;
  int *piVar8;
  undefined8 uVar9;
  ostream *poVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  char buffer [128];
  string local_280;
  string *local_260;
  long local_258;
  ulong local_250;
  longdouble local_248;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_260 = &this->print_format_;
  iVar14 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar6 = true;
        bVar7 = false;
        lVar15 = in_ST0;
      }
      else {
        piVar8 = __errno_location();
        iVar3 = *piVar8;
        *piVar8 = 0;
        strtold(__nptr,(char **)&local_280);
        if (local_280._M_dataplus._M_p == __nptr) {
          uVar9 = std::__throw_invalid_argument("stold");
LAB_001454b5:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar9);
        }
        if (*piVar8 == 0) {
          *piVar8 = iVar3;
        }
        else if (*piVar8 == 0x22) {
          uVar9 = std::__throw_out_of_range("stold");
          goto LAB_001454b5;
        }
        bVar6 = false;
        bVar7 = true;
        lVar15 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_248 = in_ST0;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      in_ST0 = lVar15;
      if (bVar7) goto LAB_0014510e;
      if (bVar6) {
        if (bVar6) {
LAB_00145461:
          bVar7 = true;
          if ((this->is_ascii_output_ == true) && (iVar14 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_0014549f:
          bVar7 = false;
        }
        return bVar7;
      }
    }
    else {
      bVar7 = sptk::ReadStream<long_double>(&local_248,input_stream);
      if (!bVar7) goto LAB_00145461;
LAB_0014510e:
      sVar1 = (short)ROUND(local_248);
      data_to_write = this->minimum_value_;
      sVar2 = this->maximum_value_;
      lVar15 = in_ST0;
      if (data_to_write < sVar2) {
        NVar4 = this->input_numeric_type_;
        if (NVar4 == kFloatingPoint) {
          in_ST6 = in_ST5;
          if (((longdouble)data_to_write <= local_248) &&
             (data_to_write = sVar2, local_248 <= (longdouble)sVar2)) goto LAB_00145231;
        }
        else {
          uVar12 = (ulong)sVar2;
          if (NVar4 == kUnsignedInteger) {
            lVar16 = (longdouble)9.223372e+18;
            lVar17 = (longdouble)0;
            if (lVar16 <= local_248) {
              lVar17 = lVar16;
            }
            local_250 = (ulong)ROUND(local_248 - lVar17);
            uVar13 = (ulong)(lVar16 <= local_248) << 0x3f ^ local_250;
            in_ST5 = in_ST4;
            in_ST6 = in_ST4;
            if ((ulong)(long)data_to_write <= uVar13) {
              bVar7 = uVar12 < uVar13;
              data_to_write = sVar1;
              if (bVar7) {
                data_to_write = sVar2;
              }
              goto LAB_00145233;
            }
          }
          else {
            if (NVar4 != kSignedInteger) goto LAB_00145231;
            local_258 = (long)ROUND(local_248);
            in_ST6 = in_ST5;
            if (data_to_write <= local_258) {
              bVar7 = (long)uVar12 < local_258;
              data_to_write = sVar1;
              if ((long)uVar12 < local_258) {
                data_to_write = sVar2;
              }
              goto LAB_00145233;
            }
          }
        }
LAB_00145289:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"th data is over the range of output type",0x28);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"x2x","");
          sptk::PrintErrorMessage(&local_280,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          WVar5 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          lVar15 = in_ST0;
          if (WVar5 == kExit) goto LAB_0014549f;
        }
      }
      else {
LAB_00145231:
        bVar7 = false;
        data_to_write = sVar1;
LAB_00145233:
        if ((bVar7) || (this->rounding_ == false)) {
          if (bVar7) goto LAB_00145289;
        }
        else {
          in_ST6 = in_ST5;
          if (local_248 <= (longdouble)0) {
            data_to_write = (short)ROUND(local_248 + (longdouble)-0.5);
          }
          else {
            data_to_write = (short)ROUND(local_248 + (longdouble)0.5);
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<short>(data_to_write,local_260,0x80,local_b8);
        if (!bVar7) goto LAB_0014549f;
        sVar11 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar11);
        if ((iVar14 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          in_ST7 = in_ST6;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar7 = sptk::WriteStream<short>(data_to_write,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar7) goto LAB_0014549f;
      }
    }
    iVar14 = iVar14 + 1;
    in_ST0 = lVar15;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }